

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O3

void pzshape::TPZShapeLinear::Chebyshev(FADREAL *x,int num,TPZVec<Fad<double>_> *phi)

{
  Fad<double> *pFVar1;
  long lVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_68;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>
  local_58;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  local_48;
  
  if (0 < num) {
    pFVar1 = phi->fStore;
    pFVar1->val_ = 1.0;
    if ((pFVar1->dx_).num_elts != 0) {
      local_48.fadexpr_.left_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar1->dx_,(double *)&local_48);
    }
    if (num != 1) {
      pFVar1 = phi->fStore;
      pFVar1[1].val_ = x->val_;
      Vector<double>::operator=(&pFVar1[1].dx_,&x->dx_);
      pFVar1[1].defaultVal = x->defaultVal;
      if (2 < (uint)num) {
        lVar2 = 0x40;
        do {
          pFVar1 = phi->fStore;
          local_68.fadexpr_.right_ = (Fad<double> *)((long)&pFVar1[-1].val_ + lVar2);
          local_48.fadexpr_.right_.constant_ = 2.0;
          local_48.fadexpr_.right_.defaultVal = 0.0;
          local_58.fadexpr_.right_ = (Fad<double> *)((long)&pFVar1[-2].val_ + lVar2);
          local_68.fadexpr_.left_ = x;
          local_58.fadexpr_.left_ = &local_48;
          local_48.fadexpr_.left_ = &local_68;
          Fad<double>::operator=((Fad<double> *)((long)&pFVar1->val_ + lVar2),&local_58);
          lVar2 = lVar2 + 0x20;
        } while ((ulong)(uint)num << 5 != lVar2);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Chebyshev(FADREAL & x,int num,TPZVec<FADREAL> &phi){
		// Quadratic or higher shape functions
		if(num <= 0) return;
		//phi.Put(0,0,1.0);
		//dphi.Put(0,0, 0.0);
		phi[0] = 1.0; // <!> Remark: the derivatives other than the 0th are set to null
		if(num == 1) return;
		//phi.Put(1,0, x);
		//dphi.Put(0,1, 1.0);
		phi[1] = x;
		//phi[1].fastAccessDx(0)=1.0; // <!> Remark: the derivatives other than the 0th aren't set to null
		//just ensuring the derivatives are properly initialized and that FAD objects of more than
		// one derivative are used
		int ord;
		for(ord = 2;ord<num;ord++) {
			//phi.Put(ord,0, 2.0*x*phi(ord-1,0) - phi(ord-2,0));
			//dphi.Put(0,ord, 2.0*x*dphi(0,ord-1) + 2.0*phi(ord-1,0) - dphi(0,ord-2));
			phi[ord] = x * phi[ord-1] * 2.0 - phi[ord-2];
		}
	}